

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

void __thiscall
spdlog::details::scoped_pad::scoped_pad
          (scoped_pad *this,size_t wrapped_size,padding_info *padinfo,memory_buffer *dest)

{
  ulong uVar1;
  ulong count;
  size_t reminder;
  size_t half_pad;
  memory_buffer *dest_local;
  padding_info *padinfo_local;
  size_t wrapped_size_local;
  scoped_pad *this_local;
  
  this->padinfo_ = padinfo;
  this->dest_ = dest;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&this->spaces_,
             "                                                                                                                                "
             ,0x80);
  if (wrapped_size < this->padinfo_->width_) {
    this->total_pad_ = padinfo->width_ - wrapped_size;
    if (this->padinfo_->side_ == left) {
      pad_it(this,this->total_pad_);
      this->total_pad_ = 0;
    }
    else if (this->padinfo_->side_ == center) {
      count = this->total_pad_ >> 1;
      uVar1 = this->total_pad_;
      pad_it(this,count);
      this->total_pad_ = count + (uVar1 & 1);
    }
  }
  else {
    this->total_pad_ = 0;
  }
  return;
}

Assistant:

scoped_pad(size_t wrapped_size, padding_info &padinfo, fmt::memory_buffer &dest)
        : padinfo_(padinfo)
        , dest_(dest)
    {

        if (padinfo_.width_ <= wrapped_size)
        {
            total_pad_ = 0;
            return;
        }

        total_pad_ = padinfo.width_ - wrapped_size;
        if (padinfo_.side_ == padding_info::left)
        {
            pad_it(total_pad_);
            total_pad_ = 0;
        }
        else if (padinfo_.side_ == padding_info::center)
        {
            auto half_pad = total_pad_ / 2;
            auto reminder = total_pad_ & 1;
            pad_it(half_pad);
            total_pad_ = half_pad + reminder; // for the right side
        }
    }